

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void rnn_parsefile(rnndb *db,char *file_orig)

{
  long lVar1;
  rnndb *db_00;
  int iVar2;
  int iVar3;
  char *__dest;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  FILE *__stream;
  char **ppcVar7;
  xmlNode *node;
  xmlNode *node_00;
  char *pcVar8;
  
  __dest = (char *)malloc(0x200);
  pcVar4 = getenv("RNN_PATH");
  pcVar8 = "./rnndb:../rnndb";
  if (pcVar4 != (char *)0x0) {
    pcVar8 = pcVar4;
  }
  while( true ) {
    pcVar4 = strchr(pcVar8,0x3a);
    if (pcVar4 == (char *)0x0) {
      sVar5 = strlen(pcVar8);
      pcVar4 = pcVar8 + sVar5;
    }
    lVar6 = (long)pcVar4 - (long)pcVar8;
    if (0x1fe < lVar6) {
      lVar6 = 0x1ff;
    }
    iVar3 = (int)lVar6;
    strncpy(__dest,pcVar8,(long)iVar3);
    snprintf(__dest + iVar3,(ulong)(0x1ff - iVar3),"/%s",file_orig);
    __stream = fopen(__dest,"r");
    if (__stream != (FILE *)0x0) break;
    pcVar8 = pcVar4 + (*pcVar4 == ':');
    if (pcVar4[*pcVar4 == ':'] == '\0') {
      strncpy(__dest,file_orig,0x1ff);
      __dest[0x1ff] = '\0';
LAB_001031f1:
      iVar3 = db->filesnum;
      if (0 < (long)iVar3) {
        ppcVar7 = db->files;
        lVar6 = 0;
        do {
          iVar2 = strcmp(ppcVar7[lVar6],__dest);
          if (iVar2 == 0) {
            return;
          }
          lVar6 = lVar6 + 1;
        } while (iVar3 != lVar6);
      }
      iVar2 = db->filesmax;
      if (iVar3 < iVar2) {
        ppcVar7 = db->files;
      }
      else {
        iVar3 = 0x10;
        if (iVar2 != 0) {
          iVar3 = iVar2 * 2;
        }
        db->filesmax = iVar3;
        ppcVar7 = (char **)realloc(db->files,(long)iVar3 << 3);
        db->files = ppcVar7;
        iVar3 = db->filesnum;
      }
      db->filesnum = iVar3 + 1;
      ppcVar7[iVar3] = __dest;
      lVar6 = xmlParseFile(__dest);
      if (lVar6 == 0) {
        fprintf(_stderr,"%s: couldn\'t open database file. Please set the env var RNN_PATH.\n",
                __dest);
        db->estatus = 1;
        return;
      }
      for (lVar1 = *(long *)(lVar6 + 0x18); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x30)) {
        if (*(int *)(lVar1 + 8) == 1) {
          pcVar8 = *(char **)(lVar1 + 0x10);
          iVar3 = strcmp(pcVar8,"database");
          if (iVar3 == 0) {
            for (node_00 = *(xmlNode **)(lVar1 + 0x18); node_00 != (xmlNode *)0x0;
                node_00 = node_00->next) {
              if ((node_00->type == XML_ELEMENT_NODE) &&
                 (pcVar8 = __dest, iVar3 = trytop(db,__dest,node_00), iVar3 == 0)) {
                db_00 = (rnndb *)node_00->name;
                iVar3 = trydoc(db_00,pcVar8,node);
                if (iVar3 == 0) {
                  fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",__dest,(ulong)node_00->line
                          ,db_00);
                  db->estatus = 1;
                }
              }
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",__dest,
                    (ulong)*(ushort *)(lVar1 + 0x70),pcVar8);
            db->estatus = 1;
          }
        }
      }
      xmlFreeDoc(lVar6);
      return;
    }
  }
  fclose(__stream);
  goto LAB_001031f1;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *file = (char *) malloc(512);

	resolve_using_path(file_orig, file, 512);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], file))
			return;
		
	ADDARRAY(db->files, file);
	xmlDocPtr doc = xmlParseFile(file);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", file);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", file, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", file, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}